

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.cpp
# Opt level: O1

void __thiscall DrawerCommandQueue::~DrawerCommandQueue(DrawerCommandQueue *this)

{
  pointer ppDVar1;
  
  StopThreads(this);
  if ((this->single_core_thread).thread._M_id._M_thread != 0) {
    std::terminate();
  }
  FString::~FString(&this->thread_error);
  std::condition_variable::~condition_variable(&this->end_condition);
  ppDVar1 = (this->active_commands).
            super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppDVar1 != (pointer)0x0) {
    operator_delete(ppDVar1,(long)(this->active_commands).
                                  super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppDVar1
                   );
  }
  std::condition_variable::~condition_variable(&this->start_condition);
  std::vector<DrawerThread,_std::allocator<DrawerThread>_>::~vector(&this->threads);
  ppDVar1 = (this->commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppDVar1 != (pointer)0x0) {
    operator_delete(ppDVar1,(long)(this->commands).
                                  super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppDVar1
                   );
    return;
  }
  return;
}

Assistant:

DrawerCommandQueue::~DrawerCommandQueue()
{
	StopThreads();
}